

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_write_set_format_by_name.c
# Opt level: O0

void test_format_by_name(char *format_name,char *compression_type,int format_id,int dot_stored,
                        void *image,size_t image_size)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  archive *paVar3;
  archive_entry *paVar4;
  archive_entry *a_00;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  char *in_R8;
  archive *in_R9;
  size_t in_stack_00000010;
  char *in_stack_00000018;
  void *in_stack_00000020;
  int r;
  char *buff;
  size_t buffsize;
  size_t used;
  archive *a;
  archive_entry *ae;
  void *in_stack_ffffffffffffff88;
  archive *paVar5;
  archive_entry *paVar6;
  void *buff_00;
  archive_entry **entry;
  archive_entry *in_stack_ffffffffffffff90;
  uint uVar7;
  char *a_01;
  archive *in_stack_ffffffffffffff98;
  archive *in_stack_ffffffffffffffa0;
  wchar_t wVar8;
  undefined4 in_stack_ffffffffffffffa8;
  Elf64_Ehdr *file;
  void *in_stack_ffffffffffffffc0;
  
  file = &Elf64_Ehdr_00100000;
  __ptr = malloc(0x100000);
  assertion_assert((char *)in_stack_ffffffffffffffa0,
                   (wchar_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                   in_stack_ffffffffffffff88);
  if (__ptr != (void *)0x0) {
    paVar3 = archive_write_new();
    assertion_assert((char *)in_stack_ffffffffffffffa0,
                     (wchar_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff88);
    iVar1 = archive_write_set_format_by_name
                      (in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90);
    if (iVar1 == -0x14) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                     ,L'1');
      wVar8 = (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
      test_skipping("%s format not fully supported on this platform",in_RSI);
      archive_write_free((archive *)0x13dba9);
      assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),wVar8,
                          (longlong)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,0,
                          (char *)0x13dbd7,in_stack_ffffffffffffffc0);
      free(__ptr);
    }
    else {
      paVar5 = paVar3;
      assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                          (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                          (longlong)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                          (longlong)paVar3,(char *)0x13dc17,in_stack_ffffffffffffffc0);
      if ((in_RSI == 0) ||
         (iVar2 = archive_write_set_format_option
                            (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                             (char *)in_stack_ffffffffffffff90,(char *)paVar5), iVar2 == 0)) {
        wVar8 = (wchar_t)((ulong)in_RSI >> 0x20);
        archive_write_add_filter_none(paVar3);
        assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                            (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            (longlong)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                            (longlong)paVar3,(char *)0x13dcea,in_stack_ffffffffffffffc0);
        archive_write_open_memory
                  ((archive *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0,
                   (size_t)in_stack_ffffffffffffff98,(size_t *)in_stack_ffffffffffffff90);
        paVar5 = paVar3;
        assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                            (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            (longlong)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                            (longlong)paVar3,(char *)0x13dd32,in_stack_ffffffffffffffc0);
        paVar4 = archive_entry_new();
        assertion_assert((char *)in_stack_ffffffffffffffa0,
                         (wchar_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,paVar5
                        );
        archive_entry_set_mtime(paVar4,1,0);
        archive_entry_mtime(paVar4);
        assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                            (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            (longlong)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,0,
                            (char *)0x13ddb3,in_stack_ffffffffffffffc0);
        archive_entry_set_ctime(paVar4,1,0);
        archive_entry_ctime(paVar4);
        assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                            (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            (longlong)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,0,
                            (char *)0x13de01,in_stack_ffffffffffffffc0);
        archive_entry_set_atime(paVar4,1,0);
        archive_entry_atime(paVar4);
        paVar6 = (archive_entry *)0x0;
        assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                            (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            (longlong)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,0,
                            (char *)0x13de4f,in_stack_ffffffffffffffc0);
        archive_entry_copy_pathname(in_stack_ffffffffffffff90,(char *)paVar6);
        uVar7 = (uint)((ulong)in_stack_ffffffffffffff90 >> 0x20);
        archive_entry_pathname(paVar6);
        a_01 = (char *)((ulong)uVar7 << 0x20);
        assertion_equal_string
                  ((char *)file,(wchar_t)((ulong)__ptr >> 0x20),
                   (char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                   (char *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,a_01,paVar4,
                   (wchar_t)in_R9);
        archive_entry_set_mode(paVar4,0x81ed);
        archive_entry_mode(paVar4);
        paVar6 = (archive_entry *)0x0;
        assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                            (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            (longlong)in_stack_ffffffffffffff98,a_01,0,(char *)0x13def3,
                            in_stack_ffffffffffffffc0);
        archive_entry_set_size(paVar4,8);
        archive_write_header((archive *)a_01,paVar6);
        buff_00 = (void *)0x0;
        assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                            (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            (longlong)in_stack_ffffffffffffff98,a_01,0,(char *)0x13df3f,
                            in_stack_ffffffffffffffc0);
        archive_entry_free((archive_entry *)0x13df49);
        archive_write_data((archive *)a_01,buff_00,0x13df5f);
        assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                            (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            (longlong)in_stack_ffffffffffffff98,a_01,0,(char *)0x13df90,
                            in_stack_ffffffffffffffc0);
        archive_write_close((archive *)0x13df9a);
        assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                            (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            (longlong)in_stack_ffffffffffffff98,a_01,(longlong)paVar3,
                            (char *)0x13dfc9,in_stack_ffffffffffffffc0);
        archive_write_free((archive *)0x13dfd3);
        paVar3 = (archive *)0x0;
        assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                            (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            (longlong)in_stack_ffffffffffffff98,a_01,0,(char *)0x13e001,
                            in_stack_ffffffffffffffc0);
        paVar5 = in_R9;
        if ((in_R8 != (char *)0x0) && (in_R9 != (archive *)0x0)) {
          a_01 = "image_size";
          in_stack_ffffffffffffff98 = (archive *)0x0;
          assertion_equal_mem(in_RDI,wVar8,(void *)CONCAT44(in_EDX,in_ECX),in_R8,in_R9,
                              (char *)paVar4,in_stack_00000010,in_stack_00000018,in_stack_00000020);
          paVar3 = in_R9;
        }
        wVar8 = (wchar_t)paVar5;
        if (0 < in_EDX) {
          a_00 = (archive_entry *)archive_read_new();
          assertion_assert((char *)in_stack_ffffffffffffffa0,
                           (wchar_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                           (wchar_t)in_stack_ffffffffffffff98,a_01,paVar3);
          archive_read_support_format_all(paVar3);
          paVar6 = a_00;
          assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                              (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                              (longlong)in_stack_ffffffffffffff98,a_01,(longlong)a_00,
                              (char *)0x13e0d2,in_stack_ffffffffffffffc0);
          archive_read_support_filter_all((archive *)paVar6);
          paVar6 = a_00;
          assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                              (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                              (longlong)in_stack_ffffffffffffff98,a_01,(longlong)a_00,
                              (char *)0x13e10b,in_stack_ffffffffffffffc0);
          read_open_memory_seek
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(size_t)a_01,(size_t)paVar6
                    );
          paVar6 = a_00;
          assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                              (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                              (longlong)in_stack_ffffffffffffff98,a_01,(longlong)a_00,
                              (char *)0x13e153,in_stack_ffffffffffffffc0);
          if ((in_ECX & 1) != 0) {
            archive_read_next_header((archive *)a_01,(archive_entry **)paVar6);
            paVar6 = a_00;
            assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                                (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                                (longlong)in_stack_ffffffffffffff98,a_01,(longlong)a_00,
                                (char *)0x13e1a1,in_stack_ffffffffffffffc0);
            archive_entry_pathname(paVar6);
            a_01 = (char *)((ulong)a_01 & 0xffffffff00000000);
            assertion_equal_string
                      ((char *)file,(wchar_t)((ulong)__ptr >> 0x20),
                       (char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                       (char *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,a_01,
                       paVar4,wVar8);
            archive_entry_filetype(paVar4);
            paVar6 = (archive_entry *)0x0;
            assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                                (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                                (longlong)in_stack_ffffffffffffff98,a_01,0,(char *)0x13e225,
                                in_stack_ffffffffffffffc0);
          }
          archive_read_next_header((archive *)a_01,(archive_entry **)paVar6);
          assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                              (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                              (longlong)in_stack_ffffffffffffff98,a_01,(longlong)a_00,
                              (char *)0x13e263,in_stack_ffffffffffffffc0);
          archive_entry_mtime(paVar4);
          paVar6 = (archive_entry *)0x0;
          assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                              (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                              (longlong)in_stack_ffffffffffffff98,a_01,0,(char *)0x13e29e,
                              in_stack_ffffffffffffffc0);
          if ((in_ECX & 2) == 0) {
            archive_entry_pathname(paVar6);
            paVar3 = (archive *)((ulong)a_01 & 0xffffffff00000000);
            assertion_equal_string
                      ((char *)file,(wchar_t)((ulong)__ptr >> 0x20),
                       (char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                       (char *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                       (char *)paVar3,paVar4,wVar8);
            wVar8 = (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
          }
          else {
            archive_entry_pathname(paVar6);
            paVar3 = (archive *)((ulong)a_01 & 0xffffffff00000000);
            assertion_equal_string
                      ((char *)file,(wchar_t)((ulong)__ptr >> 0x20),
                       (char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                       (char *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                       (char *)paVar3,paVar4,wVar8);
            wVar8 = (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
          }
          archive_entry_filetype(paVar4);
          assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),wVar8,
                              (longlong)in_stack_ffffffffffffff98,(char *)paVar3,0,(char *)0x13e377,
                              in_stack_ffffffffffffffc0);
          archive_entry_size(paVar4);
          entry = (archive_entry **)0x0;
          assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),wVar8,
                              (longlong)in_stack_ffffffffffffff98,(char *)paVar3,0,(char *)0x13e3b2,
                              in_stack_ffffffffffffffc0);
          archive_read_next_header(paVar3,entry);
          paVar4 = a_00;
          assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),wVar8,
                              (longlong)in_stack_ffffffffffffff98,(char *)paVar3,(longlong)a_00,
                              (char *)0x13e3f1,in_stack_ffffffffffffffc0);
          archive_filter_code(paVar3,(int)((ulong)paVar4 >> 0x20));
          assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),wVar8,
                              (longlong)in_stack_ffffffffffffff98,(char *)paVar3,(longlong)a_00,
                              (char *)0x13e42c,in_stack_ffffffffffffffc0);
          wVar8 = in_EDX >> 0x1f;
          archive_format((archive *)a_00);
          assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),wVar8,
                              (longlong)in_stack_ffffffffffffff98,(char *)paVar3,(longlong)a_00,
                              (char *)0x13e470,in_stack_ffffffffffffffc0);
          archive_read_close((archive *)0x13e47a);
          assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),wVar8,
                              (longlong)in_stack_ffffffffffffff98,(char *)paVar3,0,(char *)0x13e4a8,
                              in_stack_ffffffffffffffc0);
          archive_read_free((archive *)0x13e4b2);
          assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),wVar8,
                              (longlong)in_stack_ffffffffffffff98,(char *)paVar3,0,(char *)0x13e4e0,
                              in_stack_ffffffffffffffc0);
        }
        free(__ptr);
      }
      else {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_set_format_by_name.c"
                       ,L';');
        wVar8 = (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
        test_skipping("%s writing not fully supported on this platform",in_RSI);
        archive_write_free((archive *)0x13dc74);
        assertion_equal_int((char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),wVar8,
                            (longlong)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,0,
                            (char *)0x13dca2,in_stack_ffffffffffffffc0);
        free(__ptr);
      }
    }
  }
  return;
}

Assistant:

static void
test_format_by_name(const char *format_name, const char *compression_type,
    int format_id, int dot_stored, const void *image, size_t image_size)
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t buffsize = 1024 * 1024;
	char *buff;
	int r;

	assert((buff = malloc(buffsize)) != NULL);
	if (buff == NULL)
		return;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	r = archive_write_set_format_by_name(a, format_name);
	if (r == ARCHIVE_WARN) {
		skipping("%s format not fully supported on this platform",
		   compression_type);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, r);
	if (compression_type != NULL &&
	    ARCHIVE_OK != archive_write_set_format_option(a, format_name,
	    "compression", compression_type)) {
		skipping("%s writing not fully supported on this platform",
		   compression_type);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 0);
	assertEqualInt(1, archive_entry_mtime(ae));
	archive_entry_set_ctime(ae, 1, 0);
	assertEqualInt(1, archive_entry_ctime(ae));
	archive_entry_set_atime(ae, 1, 0);
	assertEqualInt(1, archive_entry_atime(ae));
	archive_entry_copy_pathname(ae, "file");
	assertEqualString("file", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));
	archive_entry_set_size(ae, 8);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 8));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	if (image && image_size > 0) {
		assertEqualMem(buff, image, image_size);
	}
	if (format_id > 0) {
		/*
		 * Now, read the data back.
		 */
		/* With the test memory reader -- seeking mode. */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    read_open_memory_seek(a, buff, used, 7));

		if (dot_stored & 1) {
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			assertEqualString(".", archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
		}
		/*
		 * Read and verify the file.
		 */
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
		assertEqualInt(1, archive_entry_mtime(ae));
		if (dot_stored & 2) {
			assertEqualString("./file", archive_entry_pathname(ae));
		} else {
			assertEqualString("file", archive_entry_pathname(ae));
		}
		assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
		assertEqualInt(8, archive_entry_size(ae));

		/* Verify the end of the archive. */
		assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

		/* Verify archive format. */
		assertEqualIntA(a, ARCHIVE_FILTER_NONE,
		    archive_filter_code(a, 0));
		assertEqualIntA(a, format_id, archive_format(a));

		assertEqualInt(ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
	free(buff);
}